

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fork.cpp
# Opt level: O2

int main(void)

{
  char cVar1;
  __pid_t _Var2;
  int iVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  fork_shared_mutex mutex_;
  int fd [2];
  string local_1c0 [32];
  ostringstream oss;
  
  booster::fork_shared_mutex::fork_shared_mutex(&mutex_);
  pipe(fd);
  _Var2 = fork();
  if (_Var2 == 0) {
    close(fd[1]);
    iVar3 = doread(fd[0]);
    if (iVar3 != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x46);
      std::operator<<(poVar4," doread(fd[0])==1");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar1 = booster::fork_shared_mutex::try_unique_lock();
    if (cVar1 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x47);
      std::operator<<(poVar4," mutex_.try_lock()");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = doread(fd[0]);
    if (iVar3 != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x48);
      std::operator<<(poVar4," doread(fd[0])==1");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::fork_shared_mutex::unlock();
    iVar3 = doread(fd[0]);
    if (iVar3 != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x4b);
      std::operator<<(poVar4," doread(fd[0])==1");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    cVar1 = booster::fork_shared_mutex::try_shared_lock();
    if (cVar1 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x4c);
      std::operator<<(poVar4," mutex_.try_shared_lock()");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::fork_shared_mutex::unlock();
    cVar1 = booster::fork_shared_mutex::try_unique_lock();
    if (cVar1 != '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x4e);
      std::operator<<(poVar4," !mutex_.try_unique_lock()");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::fork_shared_mutex::unique_lock();
    iVar3 = doread(fd[0]);
    if (iVar3 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x50);
      std::operator<<(poVar4," doread(fd[0])==0");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = 0;
    usleep(200000);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Test try_lock");
    std::endl<char,std::char_traits<char>>(poVar4);
    close(fd[0]);
    usleep(100000);
    dowrite(fd[1]);
    usleep(100000);
    cVar1 = booster::fork_shared_mutex::try_unique_lock();
    if (cVar1 != '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x33);
      std::operator<<(poVar4," !mutex_.try_lock()");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    dowrite(fd[1]);
    usleep(100000);
    cVar1 = booster::fork_shared_mutex::try_unique_lock();
    if (cVar1 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x36);
      std::operator<<(poVar4," mutex_.try_lock()");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::fork_shared_mutex::unlock();
    poVar4 = std::operator<<((ostream *)&std::cout,"Test shared/unique");
    std::endl<char,std::char_traits<char>>(poVar4);
    booster::fork_shared_mutex::shared_lock();
    dowrite(fd[1]);
    usleep(100000);
    close(fd[1]);
    booster::fork_shared_mutex::unlock();
    poVar4 = std::operator<<((ostream *)&std::cout,"Test unlock on exit");
    std::endl<char,std::char_traits<char>>(poVar4);
    usleep(100000);
    cVar1 = booster::fork_shared_mutex::try_unique_lock();
    if (cVar1 != '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x40);
      std::operator<<(poVar4," !mutex_.try_lock()");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    usleep(500000);
    cVar1 = booster::fork_shared_mutex::try_unique_lock();
    if (cVar1 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar4 = std::operator<<((ostream *)&oss,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_fork.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x42);
      std::operator<<(poVar4," mutex_.try_lock()");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar5,local_1c0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    wait(&oss);
    if ((_oss & 0xff7f) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Ok");
      iVar3 = 0;
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      iVar3 = 1;
    }
  }
  booster::fork_shared_mutex::~fork_shared_mutex(&mutex_);
  return iVar3;
}

Assistant:

int main()
{
	booster::fork_shared_mutex mutex_;
	int fd[2];
	int res =  pipe(fd);
	(void)(res);
	int pid = fork();
	try {
		if(pid!=0) { // parent

			std::cout << "Test try_lock" << std::endl;
			close(fd[0]);
			usleep(100000);
			dowrite(fd[1]);
			usleep(100000);
			TEST(!mutex_.try_lock());
			dowrite(fd[1]);
			usleep(100000);
			TEST(mutex_.try_lock());
			mutex_.unlock();
			std::cout << "Test shared/unique" << std::endl;
			mutex_.shared_lock();
			dowrite(fd[1]);
			usleep(100000);
			close(fd[1]);
			mutex_.unlock();
			std::cout << "Test unlock on exit" << std::endl;
			usleep(100000);
			TEST(!mutex_.try_lock());
			usleep(500000);
			TEST(mutex_.try_lock());
		}
		else { // child
			close(fd[1]);
			TEST(doread(fd[0])==1);
			TEST(mutex_.try_lock());
			TEST(doread(fd[0])==1);
			mutex_.unlock();
			// test 2
			TEST(doread(fd[0])==1);
			TEST(mutex_.try_shared_lock());
			mutex_.unlock();
			TEST(!mutex_.try_unique_lock());
			mutex_.unique_lock();
			TEST(doread(fd[0])==0);
			usleep(200000);
			return 0;
		}
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		if(pid!=0) {
			int res;
			::wait(&res);
		}
		return 1;
	}
	if(pid!=0) {
		int res;
		::wait(&res);
		if(WIFEXITED(res) && WEXITSTATUS(res)==0) {
			std::cerr << "Ok" <<std::endl;
			return 0;
		}
		return 1;
	}
	return 0;
}